

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.cpp
# Opt level: O2

void __thiscall
zmq::socks_response_t::socks_response_t
          (socks_response_t *this,uint8_t response_code_,string *address_,uint16_t port_)

{
  this->response_code = response_code_;
  std::__cxx11::string::string((string *)&this->address,(string *)address_);
  this->port = port_;
  return;
}

Assistant:

zmq::socks_response_t::socks_response_t (uint8_t response_code_,
                                         const std::string &address_,
                                         uint16_t port_) :
    response_code (response_code_),
    address (address_),
    port (port_)
{
}